

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

_Bool btorsim_bv_is_umulo(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  BtorSimBitVector *bv;
  BtorSimBitVector *bv_00;
  
  if (a->width < 2) {
    _Var1 = false;
  }
  else {
    a_00 = btorsim_bv_uext(a,a->width);
    b_00 = btorsim_bv_uext(b,b->width);
    bv = btorsim_bv_mul(a_00,b_00);
    bv_00 = btorsim_bv_slice(bv,bv->width - 1,a->width);
    _Var1 = btorsim_bv_is_zero(bv_00);
    _Var1 = !_Var1;
    free(a_00);
    free(b_00);
    free(bv);
    free(bv_00);
  }
  return _Var1;
}

Assistant:

bool
btorsim_bv_is_umulo (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  bool res;
  BtorSimBitVector *aext, *bext, *mul, *o;

  res = false;

  if (a->width > 1)
  {
    aext = btorsim_bv_uext (a, a->width);
    bext = btorsim_bv_uext (b, b->width);
    mul  = btorsim_bv_mul (aext, bext);
    o    = btorsim_bv_slice (mul, mul->width - 1, a->width);
    if (!btorsim_bv_is_zero (o)) res = true;
    free (aext);
    free (bext);
    free (mul);
    free (o);
  }

  return res;
}